

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

int __thiscall fmt::v6::detail::bigint::divmod_assign(bigint *this,bigint *divisor)

{
  uint *puVar1;
  int iVar2;
  type tVar3;
  uint uVar4;
  int iVar5;
  uint *puVar6;
  char *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  if (this == divisor) {
    assert_fail((char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),0,
                in_stack_ffffffffffffffc8);
  }
  iVar2 = compare(this,divisor);
  if (iVar2 < 0) {
    iVar2 = 0;
  }
  else {
    if ((divisor->bigits_).super_buffer<unsigned_int>.ptr_
        [(divisor->bigits_).super_buffer<unsigned_int>.size_ - 1] == 0) {
      assert_fail((char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),0,
                  in_stack_ffffffffffffffc8);
    }
    iVar2 = this->exp_ - divisor->exp_;
    if (iVar2 != 0 && divisor->exp_ <= this->exp_) {
      uVar4 = (uint)(this->bigits_).super_buffer<unsigned_int>.size_;
      tVar3 = to_unsigned<int>(iVar2 + uVar4);
      buffer<unsigned_int>::resize((buffer<unsigned_int> *)this,(ulong)tVar3);
      puVar1 = (this->bigits_).super_buffer<unsigned_int>.ptr_;
      puVar6 = puVar1 + (int)(iVar2 + uVar4 + -1);
      while (uVar4 = uVar4 - 1, -1 < (int)uVar4) {
        *puVar6 = puVar1[uVar4];
        puVar6 = puVar6 + -1;
      }
      std::__fill_n_a<unsigned_int*,int,int>(puVar1,iVar2);
      this->exp_ = this->exp_ - iVar2;
    }
    iVar2 = 0;
    do {
      subtract_aligned(this,divisor);
      iVar2 = iVar2 + 1;
      iVar5 = compare(this,divisor);
    } while (-1 < iVar5);
  }
  return iVar2;
}

Assistant:

int divmod_assign(const bigint& divisor) {
    FMT_ASSERT(this != &divisor, "");
    if (compare(*this, divisor) < 0) return 0;
    int num_bigits = static_cast<int>(bigits_.size());
    FMT_ASSERT(divisor.bigits_[divisor.bigits_.size() - 1u] != 0, "");
    int exp_difference = exp_ - divisor.exp_;
    if (exp_difference > 0) {
      // Align bigints by adding trailing zeros to simplify subtraction.
      bigits_.resize(to_unsigned(num_bigits + exp_difference));
      for (int i = num_bigits - 1, j = i + exp_difference; i >= 0; --i, --j)
        bigits_[j] = bigits_[i];
      std::uninitialized_fill_n(bigits_.data(), exp_difference, 0);
      exp_ -= exp_difference;
    }
    int quotient = 0;
    do {
      subtract_aligned(divisor);
      ++quotient;
    } while (compare(*this, divisor) >= 0);
    return quotient;
  }